

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

string * __thiscall cmCTest::CurrentTime_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  tm *__tp;
  size_t sVar1;
  char *__format;
  time_t currenttime;
  ostringstream cmCTestLog_msg;
  char current_time [1024];
  long *local_5c8;
  long local_5b8 [2];
  time_t local_5a8;
  undefined1 local_5a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590 [6];
  ios_base local_530 [264];
  char local_428 [1032];
  
  local_5a8 = time((time_t *)0x0);
  __tp = localtime(&local_5a8);
  __format = "%a %b %d %H:%M:%S %Z %Y";
  if (this->ShortDateFormat != false) {
    __format = "%b %d %H:%M %Z";
  }
  strftime(local_428,1000,__format,__tp);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,"   Current_Time: ",0x11);
  sVar1 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,local_428,sVar1);
  std::ios::widen((char)(ostream *)local_5a0 + (char)*(_func_int **)(local_5a0._0_8_ + -0x18));
  std::ostream::put((char)local_5a0);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x9c,(char *)local_5c8,false);
  if (local_5c8 != local_5b8) {
    operator_delete(local_5c8,local_5b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
  std::ios_base::~ios_base(local_530);
  local_5a0._0_8_ = local_5a0 + 0x10;
  sVar1 = strlen(local_428);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,local_428,local_428 + sVar1);
  CleanString(__return_storage_ptr__,(string *)local_5a0);
  if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
    operator_delete((void *)local_5a0._0_8_,local_590[0]._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::CurrentTime()
{
  time_t currenttime = time(0);
  struct tm* t = localtime(&currenttime);
  //return ::CleanString(ctime(&currenttime));
  char current_time[1024];
  if ( this->ShortDateFormat )
    {
    strftime(current_time, 1000, "%b %d %H:%M %Z", t);
    }
  else
    {
    strftime(current_time, 1000, "%a %b %d %H:%M:%S %Z %Y", t);
    }
  cmCTestLog(this, DEBUG, "   Current_Time: " << current_time << std::endl);
  return cmCTest::CleanString(current_time);
}